

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::TaggedUnionExpressionSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,TaggedUnionExpressionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  size_t index_local;
  TaggedUnionExpressionSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->tagged).kind;
    token._2_1_ = (this->tagged).field_0x2;
    token.numFlags.raw = (this->tagged).numFlags.raw;
    token.rawLen = (this->tagged).rawLen;
    token.info = (this->tagged).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->member).kind;
    token_00._2_1_ = (this->member).field_0x2;
    token_00.numFlags.raw = (this->member).numFlags.raw;
    token_00.rawLen = (this->member).rawLen;
    token_00.info = (this->member).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else if (index == 2) {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->expr->super_SyntaxNode);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax TaggedUnionExpressionSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return tagged;
        case 1: return member;
        case 2: return expr;
        default: return nullptr;
    }
}